

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

void strskip(char *s,char c,char e)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  char *out;
  char *pcVar4;
  
  bVar1 = false;
  pcVar4 = s;
  do {
    cVar3 = *pcVar4;
    if (cVar3 == '\0') {
      *s = '\0';
      return;
    }
    if (cVar3 == c) {
LAB_001eb5c8:
      bVar2 = true;
      if ((cVar3 != e) && (bVar2 = bVar1, bVar1)) goto LAB_001eb5f3;
    }
    else {
      if (cVar3 == e) {
        if (!bVar1) goto LAB_001eb5c8;
LAB_001eb5ec:
        *s = e;
        s = s + 1;
        cVar3 = *pcVar4;
      }
      else if (bVar1) goto LAB_001eb5ec;
LAB_001eb5f3:
      *s = cVar3;
      s = s + 1;
      bVar2 = false;
    }
    bVar1 = bVar2;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

void strskip(char *s, const char c, const char e) {
	char *in = s;
	char *out = s;
	bool escapeseen = false;
	while (*in) {
		if ((*in != c) && ((*in != e) || escapeseen)) {
			if (escapeseen) {
				/* Not escaping anything */
				*out = e;
				out++;
			}
			*out = *in;
			out++;
			escapeseen = false;
		} else if (*in == e) {
			/* Maybe escaping something */
			escapeseen = true;
		} else if (escapeseen) {
			/* Add the escaped character */
			*out = *in;
			out++;
			escapeseen = false;
		}
		in++;
	}
	*out = 0;
}